

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  ImDrawList *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiCol idx;
  ImGuiPtrOrIndex IVar3;
  ImVec2 local_a8;
  ImVec2 local_a0;
  float local_98;
  float local_94;
  float separator_max_x_1;
  float separator_min_x_1;
  ImVec2 local_88;
  float local_80;
  float local_7c;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImVec2 local_68;
  void *local_60;
  int local_58;
  ImGuiPtrOrIndex local_50;
  ImGuiWindow *local_40;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDockNode *dock_node_local;
  ImRect *pIStack_20;
  ImGuiTabBarFlags flags_local;
  ImRect *tab_bar_bb_local;
  ImGuiTabBar *tab_bar_local;
  
  window = (ImGuiWindow *)GImGui;
  local_40 = GImGui->CurrentWindow;
  if ((local_40->SkipItems & 1U) == 0) {
    g = (ImGuiContext *)dock_node;
    dock_node_local._4_4_ = (float)flags;
    pIStack_20 = tab_bar_bb;
    tab_bar_bb_local = (ImRect *)tab_bar;
    if ((flags & 0x100000U) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar2 = window + 7;
    IVar3 = GetTabBarRefFromTabBar((ImGuiTabBar *)tab_bar_bb_local);
    local_60 = IVar3.Ptr;
    local_58 = IVar3.Index;
    local_50.Ptr = local_60;
    local_50.Index = local_58;
    ImVector<ImGuiPtrOrIndex>::push_back((ImVector<ImGuiPtrOrIndex> *)&pIVar2->InnerRect,&local_50);
    *(ImRect **)&window[7].DC.TextWrapPosStack = tab_bar_bb_local;
    tab_bar_bb_local[8].Min = (local_40->DC).CursorPos;
    if (tab_bar_bb_local[2].Min.y == (float)window[6].DC.LastItemStatusFlags) {
      ImVec2::ImVec2(&local_68,tab_bar_bb_local[2].Max.y,
                     tab_bar_bb_local[3].Max.x + tab_bar_bb_local[7].Min.y);
      (local_40->DC).CursorPos = local_68;
      *(char *)((long)&tab_bar_bb_local[6].Max.x + 1) =
           *(char *)((long)&tab_bar_bb_local[6].Max.x + 1) + '\x01';
      tab_bar_local._7_1_ = true;
    }
    else {
      if ((((((uint)dock_node_local._4_4_ & 1) != ((uint)tab_bar_bb_local[1].Min.x & 1)) ||
           ((((uint)tab_bar_bb_local[6].Max.y & 1) != 0 && (((uint)dock_node_local._4_4_ & 1) == 0))
           )) && (1 < (int)(tab_bar_bb_local->Min).x)) &&
         (((uint)dock_node_local._4_4_ & 0x100000) == 0)) {
        qsort((void *)tab_bar_bb_local->Max,(long)(int)(tab_bar_bb_local->Min).x,0x30,
              TabItemComparerByBeginOrder);
      }
      *(undefined1 *)&tab_bar_bb_local[6].Max.y = 0;
      if (((uint)dock_node_local._4_4_ & 0xc0) == 0) {
        dock_node_local._4_4_ = (float)((uint)dock_node_local._4_4_ | 0x40);
      }
      tab_bar_bb_local[1].Min.x = dock_node_local._4_4_;
      *(ImVec2 *)&tab_bar_bb_local[2].Max.y = pIStack_20->Min;
      *(ImVec2 *)&tab_bar_bb_local[3].Min.y = pIStack_20->Max;
      *(undefined1 *)((long)&tab_bar_bb_local[6].Max.x + 2) = 1;
      tab_bar_bb_local[2].Max.x = tab_bar_bb_local[2].Min.y;
      tab_bar_bb_local[2].Min.y = (float)window[6].DC.LastItemStatusFlags;
      tab_bar_bb_local[4].Min.x = tab_bar_bb_local[3].Max.y;
      tab_bar_bb_local[3].Max.y = 0.0;
      tab_bar_bb_local[7].Min.y = *(float *)&window[5].AutoFitFramesX;
      tab_bar_bb_local[7].Max = *(ImVec2 *)&window[5].WasActive;
      *(undefined2 *)((long)&tab_bar_bb_local[6].Max.y + 2) = 0;
      *(undefined1 *)((long)&tab_bar_bb_local[6].Max.x + 1) = 1;
      ImVec2::ImVec2((ImVec2 *)&y,tab_bar_bb_local[2].Max.y,
                     tab_bar_bb_local[3].Max.x + tab_bar_bb_local[7].Min.y);
      (local_40->DC).CursorPos = _y;
      idx = 0x25;
      if (((uint)dock_node_local._4_4_ & 0x200000) != 0) {
        idx = 0x23;
      }
      separator_min_x = (float)GetColorU32(idx,1.0);
      separator_max_x = tab_bar_bb_local[3].Max.x - 1.0;
      if (g == (ImGuiContext *)0x0) {
        local_94 = tab_bar_bb_local[2].Max.y - (float)(int)((local_40->WindowPadding).x * 0.5);
        local_98 = tab_bar_bb_local[3].Min.y + (float)(int)((local_40->WindowPadding).x * 0.5);
        pIVar1 = local_40->DrawList;
        ImVec2::ImVec2(&local_a0,local_94,separator_max_x);
        ImVec2::ImVec2(&local_a8,local_98,separator_max_x);
        ImDrawList::AddLine(pIVar1,&local_a0,&local_a8,(ImU32)separator_min_x,1.0);
      }
      else {
        local_7c = (float)(g->IO).KeyMap[1] + local_40->WindowBorderSize;
        local_80 = ((float)(g->IO).KeyMap[1] + (float)(g->IO).KeyMap[3]) -
                   local_40->WindowBorderSize;
        pIVar1 = local_40->DrawList;
        ImVec2::ImVec2(&local_88,local_7c,separator_max_x);
        ImVec2::ImVec2((ImVec2 *)&separator_max_x_1,local_80,separator_max_x);
        ImDrawList::AddLine(pIVar1,&local_88,(ImVec2 *)&separator_max_x_1,(ImU32)separator_min_x,1.0
                           );
      }
      tab_bar_local._7_1_ = true;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1 && (flags & ImGuiTabBarFlags_DockNode) == 0) // FIXME: TabBar with DockNode can now be hybrid
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}